

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageImage::verify
          (RenderFragmentStorageImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  TextureLevel *pTVar4;
  TextureLevel *extraout_RAX;
  uint x;
  uint uVar5;
  uint y;
  int iVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  UVec4 value;
  Vec4 floatValue;
  undefined1 local_88 [32];
  Vector<float,_4> local_68;
  PixelBufferAccess local_58;
  
  uVar1 = *(uint *)(*(long *)ctx + 0x50);
  uVar2 = *(uint *)(*(long *)ctx + 0x54);
  uVar3 = uVar2 * uVar1 >> 0x10;
  pTVar4 = (TextureLevel *)(ctx + 8);
  for (y = 0; (int)y < *(int *)(ctx + 0x14); y = y + 1) {
    for (x = 0; (int)x < *(int *)(ctx + 0x10); x = x + 1) {
      uVar10 = 0;
      uVar5 = 0;
      uVar8 = x;
      iVar6 = uVar3 + (uVar3 == 0);
      uVar9 = y;
      while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
        tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(*(long *)ctx + 0x48));
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_88,(int)&local_58,
                   (uVar5 * 0x100 + (uVar8 ^ uVar5)) % uVar1,
                   (uVar10 * 0x100 + (uVar9 ^ uVar10)) % uVar2);
        uVar8 = (uint)((float)local_88._0_4_ * 255.0);
        uVar9 = (uint)((float)local_88._4_4_ * 255.0);
        uVar5 = (uint)((float)local_88._8_4_ * 255.0);
        uVar10 = (uint)((float)local_88._12_4_ * 255.0);
        uVar8 = (int)((float)local_88._0_4_ * 255.0 - 2.1474836e+09) & (int)uVar8 >> 0x1f | uVar8;
        uVar9 = (int)((float)local_88._4_4_ * 255.0 - 2.1474836e+09) & (int)uVar9 >> 0x1f | uVar9;
        uVar5 = (int)((float)local_88._8_4_ * 255.0 - 2.1474836e+09) & (int)uVar5 >> 0x1f | uVar5;
        uVar10 = (int)((float)local_88._12_4_ * 255.0 - 2.1474836e+09) & (int)uVar10 >> 0x1f |
                 uVar10;
      }
      tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
      tcu::Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)&local_68);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_88 + 0x10),255.0);
      tcu::operator/((tcu *)local_88,&local_68,(Vector<float,_4> *)(local_88 + 0x10));
      tcu::PixelBufferAccess::setPixel(&local_58,(Vec4 *)local_88,x,y,0);
      pTVar4 = extraout_RAX;
    }
  }
  return (int)pTVar4;
}

Assistant:

void RenderFragmentStorageImage::verify (VerifyRenderPassContext& context, size_t)
{
	const UVec2		size			= UVec2(context.getReferenceImage().getWidth(), context.getReferenceImage().getHeight());
	const deUint32	valuesPerPixel	= de::max<deUint32>(1u, (size.x() * size.y()) / (256u * 256u));

	for (int y = 0; y < context.getReferenceTarget().getSize().y(); y++)
	for (int x = 0; x < context.getReferenceTarget().getSize().x(); x++)
	{
		UVec4	value	= UVec4(x, y, 0u, 0u);

		for (deUint32 i = 0; i < valuesPerPixel; i++)
		{
			const UVec2	pos			= UVec2(value.z() * 256u + (value.x() ^ value.z()), value.w() * 256u + (value.y() ^ value.w()));
			const Vec4	floatValue	= context.getReferenceImage().getAccess().getPixel(pos.x() % size.x(), pos.y() % size.y());

			value = UVec4((deUint32)(floatValue.x() * 255.0f),
						  (deUint32)(floatValue.y() * 255.0f),
						  (deUint32)(floatValue.z() * 255.0f),
						  (deUint32)(floatValue.w() * 255.0f));

		}
		context.getReferenceTarget().getAccess().setPixel(value.asFloat() / Vec4(255.0f), x, y);
	}
}